

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O3

void gen_spr_401_403(CPUPPCState_conflict2 *env)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  if ((((env->spr_cb[0x3cc].name == (char *)0x0) && (env->spr[0x3cc] == 0)) &&
      (env->spr_cb[0x3cc].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
     (((env->spr_cb[0x3cc].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
       (env->spr_cb[0x3cc].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
      (env->spr_cb[0x3cc].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
    env->spr_cb[0x3cc].name = "TBL";
    env->spr_cb[0x3cc].uea_read = spr_read_tbl;
    env->spr_cb[0x3cc].uea_write = spr_noaccess;
    env->spr_cb[0x3cc].oea_read = spr_read_tbl;
    env->spr_cb[0x3cc].oea_write = spr_noaccess;
    env->spr_cb[0x3cc].hea_read = spr_read_tbl;
    env->spr_cb[0x3cc].hea_write = spr_noaccess;
    env->spr_cb[0x3cc].default_value = 0;
    env->spr[0x3cc] = 0;
    if (((env->spr_cb[0x3dc].name == (char *)0x0) && (env->spr[0x3dc] == 0)) &&
       ((env->spr_cb[0x3dc].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
        (((env->spr_cb[0x3dc].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
          (env->spr_cb[0x3dc].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
         (env->spr_cb[0x3dc].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
      env->spr_cb[0x3dc].name = "TBL";
      env->spr_cb[0x3dc].uea_read = spr_noaccess;
      env->spr_cb[0x3dc].uea_write = spr_noaccess;
      env->spr_cb[0x3dc].oea_read = spr_noaccess;
      env->spr_cb[0x3dc].oea_write = spr_write_tbl;
      env->spr_cb[0x3dc].hea_read = spr_noaccess;
      env->spr_cb[0x3dc].hea_write = spr_write_tbl;
      env->spr_cb[0x3dc].default_value = 0;
      env->spr[0x3dc] = 0;
      if ((((env->spr_cb[0x3cd].name == (char *)0x0) && (env->spr[0x3cd] == 0)) &&
          ((env->spr_cb[0x3cd].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
           ((env->spr_cb[0x3cd].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
            (env->spr_cb[0x3cd].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))))) &&
         (env->spr_cb[0x3cd].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
        env->spr_cb[0x3cd].name = "TBU";
        env->spr_cb[0x3cd].uea_read = spr_read_tbu;
        env->spr_cb[0x3cd].uea_write = spr_noaccess;
        env->spr_cb[0x3cd].oea_read = spr_read_tbu;
        env->spr_cb[0x3cd].oea_write = spr_noaccess;
        env->spr_cb[0x3cd].hea_read = spr_read_tbu;
        env->spr_cb[0x3cd].hea_write = spr_noaccess;
        env->spr_cb[0x3cd].default_value = 0;
        env->spr[0x3cd] = 0;
        if (((((env->spr_cb[0x3dd].name == (char *)0x0) && (env->spr[0x3dd] == 0)) &&
             (env->spr_cb[0x3dd].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
            ((env->spr_cb[0x3dd].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
             (env->spr_cb[0x3dd].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
           (env->spr_cb[0x3dd].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
          env->spr_cb[0x3dd].name = "TBU";
          env->spr_cb[0x3dd].uea_read = spr_noaccess;
          env->spr_cb[0x3dd].uea_write = spr_noaccess;
          env->spr_cb[0x3dd].oea_read = spr_noaccess;
          env->spr_cb[0x3dd].oea_write = spr_write_tbu;
          env->spr_cb[0x3dd].hea_read = spr_noaccess;
          env->spr_cb[0x3dd].hea_write = spr_write_tbu;
          env->spr_cb[0x3dd].default_value = 0;
          env->spr[0x3dd] = 0;
          if (((env->spr_cb[0x3d7].name == (char *)0x0) && (env->spr[0x3d7] == 0)) &&
             ((env->spr_cb[0x3d7].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
              (((env->spr_cb[0x3d7].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                (env->spr_cb[0x3d7].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
               (env->spr_cb[0x3d7].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
            env->spr_cb[0x3d7].name = "CDBCR";
            env->spr_cb[0x3d7].uea_read = spr_noaccess;
            env->spr_cb[0x3d7].uea_write = spr_noaccess;
            env->spr_cb[0x3d7].oea_read = spr_read_generic;
            env->spr_cb[0x3d7].oea_write = spr_write_generic;
            env->spr_cb[0x3d7].hea_read = spr_read_generic;
            env->spr_cb[0x3d7].hea_write = spr_write_generic;
            env->spr_cb[0x3d7].default_value = 0;
            env->spr[0x3d7] = 0;
            return;
          }
          uVar2 = 0x3d7;
          uVar1 = 0x3d7;
        }
        else {
          uVar2 = 0x3dd;
          uVar1 = 0x3dd;
        }
      }
      else {
        uVar2 = 0x3cd;
        uVar1 = 0x3cd;
      }
    }
    else {
      uVar2 = 0x3dc;
      uVar1 = 0x3dc;
    }
  }
  else {
    uVar2 = 0x3cc;
    uVar1 = 0x3cc;
  }
  printf("Error: Trying to register SPR %d (%03x) twice !\n",uVar2,uVar1);
  exit(1);
}

Assistant:

static void gen_spr_401_403(CPUPPCState *env)
{
    /* Time base */
    spr_register(env, SPR_403_VTBL,  "TBL",
                 &spr_read_tbl, SPR_NOACCESS,
                 &spr_read_tbl, SPR_NOACCESS,
                 0x00000000);
    spr_register(env, SPR_403_TBL,   "TBL",
                 SPR_NOACCESS, SPR_NOACCESS,
                 SPR_NOACCESS, &spr_write_tbl,
                 0x00000000);
    spr_register(env, SPR_403_VTBU,  "TBU",
                 &spr_read_tbu, SPR_NOACCESS,
                 &spr_read_tbu, SPR_NOACCESS,
                 0x00000000);
    spr_register(env, SPR_403_TBU,   "TBU",
                 SPR_NOACCESS, SPR_NOACCESS,
                 SPR_NOACCESS, &spr_write_tbu,
                 0x00000000);
    /* Debug */
    /* not emulated, as QEMU do not emulate caches */
    spr_register(env, SPR_403_CDBCR, "CDBCR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
}